

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.h
# Opt level: O1

void __thiscall
agge::renderer::operator()
          (renderer *this,bitmap<unsigned_char,_0UL,_0UL> *bitmap_,vector_i offset,rect_i *window,
          rasterizer<agge::tests::(anonymous_namespace)::passthrough_clipper<float>,_agge::scaling<float>_>
          *mask,blender<unsigned_char,_unsigned_char> *blender,
          simple_alpha<unsigned_char,_8UL> *alpha)

{
  short *psVar1;
  short sVar2;
  count_t cVar3;
  int iVar4;
  uint8_t *puVar5;
  pointer puVar6;
  uint length;
  short *psVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint8_t *puVar13;
  uint *puVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  short *psVar20;
  uint uVar21;
  uint8_t *__s;
  int iVar22;
  long lVar23;
  int iVar24;
  uint8_t uVar25;
  uint uVar26;
  int y;
  uint uVar27;
  long lVar28;
  
  iVar18 = offset.dx;
  iVar9 = bitmap_->_width + iVar18;
  uVar19 = (window[6].x2 - window[6].y1) + 1;
  if (window[6].y2 < window[6].x1) {
    uVar19 = 0;
  }
  cVar3 = bitmap_->_height;
  uVar26 = uVar19 + 4;
  if ((this->_scanline_cache)._size < uVar26) {
    puVar13 = (uint8_t *)operator_new__((ulong)uVar26);
    puVar5 = (this->_scanline_cache)._buffer;
    if (puVar5 != (uint8_t *)0x0) {
      operator_delete__(puVar5);
    }
    (this->_scanline_cache)._buffer = puVar13;
    (this->_scanline_cache)._size = uVar26;
    if (uVar19 < 0xfffffffc) {
      memset(puVar13,0,(ulong)uVar26);
    }
    else {
      *puVar13 = '\0';
      if (uVar26 == 1) {
        puVar13 = puVar13 + 1;
      }
      else {
        puVar13[1] = '\0';
        puVar13 = puVar13 + 2;
      }
      if (uVar26 != 2) {
        *puVar13 = '\0';
      }
    }
  }
  iVar4 = window[6].x1;
  lVar28 = (long)iVar4;
  iVar10 = (window[6].y2 - iVar4) + 1;
  if (window[6].y2 < iVar4) {
    iVar10 = 0;
  }
  if (0 < iVar10) {
    puVar5 = (this->_scanline_cache)._buffer;
    do {
      if (lVar28 < (long)(int)cVar3 + ((long)offset >> 0x20) && (long)offset >> 0x20 <= lVar28) {
        y = (int)lVar28;
        puVar6 = (bitmap_->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar8 = (ulong)bitmap_->_width * (ulong)(uint)(y - offset.dy) - (long)iVar18;
        puVar14 = (uint *)(lVar28 * 4 + *(long *)&window[1].x2 + (long)window[6].x1 * -4);
        uVar19 = *puVar14;
        uVar26 = puVar14[1];
        iVar22 = 0;
        iVar11 = 0;
        if (uVar19 != uVar26) {
          psVar20 = (short *)(*(long *)window + (ulong)uVar19 * 10);
          psVar1 = (short *)(*(long *)window + (ulong)uVar26 * 10);
          iVar22 = 0;
          iVar11 = 0;
          uVar19 = 0;
          puVar13 = puVar5;
LAB_00160427:
          sVar2 = *psVar20;
          iVar24 = (int)sVar2;
          iVar12 = 0;
          psVar7 = psVar20;
          do {
            psVar20 = psVar7 + 5;
            iVar12 = iVar12 + *(int *)(psVar7 + 2);
            uVar19 = (int)psVar7[4] + uVar19;
            if (psVar20 == psVar1) break;
            psVar7 = psVar20;
          } while (*psVar20 == sVar2);
          if (iVar12 != 0) {
            iVar12 = (int)(uVar19 * 0x200 - iVar12) >> 9;
            if (0xfe < iVar12) {
              iVar12 = 0xff;
            }
            iVar17 = iVar11;
            if (iVar22 != iVar24) {
              iVar16 = iVar11;
              if (iVar18 - iVar11 != 0 && iVar11 <= iVar18) {
                iVar16 = iVar18;
              }
              iVar15 = -(iVar18 - iVar11);
              iVar17 = 0;
              if (iVar11 < iVar18) {
                iVar17 = iVar15;
              }
              uVar27 = iVar17 + (iVar22 - iVar11);
              uVar26 = iVar9 - iVar16;
              if ((int)uVar27 < iVar9 - iVar16) {
                uVar26 = uVar27;
              }
              puVar13 = puVar5;
              iVar22 = iVar24;
              iVar17 = iVar24;
              if (0 < (int)uVar26) {
                lVar23 = -(long)iVar15;
                if (iVar18 <= iVar11) {
                  lVar23 = 0;
                }
                tests::mocks::blender<unsigned_char,_unsigned_char>::operator()
                          ((blender<unsigned_char,_unsigned_char> *)mask,puVar6 + iVar16 + lVar8,
                           iVar16,y,uVar26,puVar5 + lVar23);
              }
            }
            iVar22 = iVar22 + 1;
            *puVar13 = (uint8_t)iVar12;
            puVar13 = puVar13 + 1;
            iVar24 = iVar24 + 1;
            iVar11 = iVar17;
          }
          if (psVar20 != psVar1) {
            sVar2 = *psVar20;
            uVar26 = sVar2 - iVar24;
            if ((uVar26 != 0) && ((uVar19 & 0x7fffff) != 0)) {
              uVar27 = (int)(uVar19 * 0x200) >> 9;
              if (0xfe < (int)uVar27) {
                uVar27 = 0xff;
              }
              __s = puVar13;
              iVar12 = iVar11;
              if (iVar22 != iVar24) {
                iVar17 = iVar11;
                if (iVar18 - iVar11 != 0 && iVar11 <= iVar18) {
                  iVar17 = iVar18;
                }
                iVar16 = -(iVar18 - iVar11);
                iVar12 = 0;
                if (iVar11 < iVar18) {
                  iVar12 = iVar16;
                }
                uVar21 = iVar12 + (iVar22 - iVar11);
                length = iVar9 - iVar17;
                if ((int)uVar21 < iVar9 - iVar17) {
                  length = uVar21;
                }
                __s = puVar5;
                iVar22 = iVar24;
                iVar12 = iVar24;
                if (0 < (int)length) {
                  lVar23 = -(long)iVar16;
                  if (iVar18 <= iVar11) {
                    lVar23 = 0;
                  }
                  tests::mocks::blender<unsigned_char,_unsigned_char>::operator()
                            ((blender<unsigned_char,_unsigned_char> *)mask,puVar6 + iVar17 + lVar8,
                             iVar17,y,length,puVar5 + lVar23);
                }
              }
              iVar11 = iVar12;
              iVar22 = iVar22 + uVar26;
              puVar13 = __s + uVar26;
              uVar25 = (uint8_t)uVar27;
              if (uVar26 < 4) {
                if (sVar2 != iVar24) {
                  *__s = uVar25;
                  __s = __s + 1;
                }
                if (uVar26 != 1) {
                  *__s = uVar25;
                  __s = __s + 1;
                }
                if (uVar26 != 2) {
                  *__s = uVar25;
                }
              }
              else {
                memset(__s,uVar27 & 0xff,(ulong)uVar26);
              }
            }
            goto LAB_00160427;
          }
        }
        iVar12 = iVar11;
        if (iVar18 - iVar11 != 0 && iVar11 <= iVar18) {
          iVar12 = iVar18;
        }
        iVar17 = -(iVar18 - iVar11);
        iVar24 = 0;
        if (iVar11 < iVar18) {
          iVar24 = iVar17;
        }
        uVar26 = iVar24 + (iVar22 - iVar11);
        uVar19 = iVar9 - iVar12;
        if ((int)uVar26 < iVar9 - iVar12) {
          uVar19 = uVar26;
        }
        if (0 < (int)uVar19) {
          lVar23 = -(long)iVar17;
          if (iVar18 <= iVar11) {
            lVar23 = 0;
          }
          tests::mocks::blender<unsigned_char,_unsigned_char>::operator()
                    ((blender<unsigned_char,_unsigned_char> *)mask,puVar6 + iVar12 + lVar8,iVar12,y,
                     uVar19,puVar5 + lVar23);
        }
      }
      lVar28 = lVar28 + 1;
    } while (lVar28 < iVar10 + iVar4);
  }
  return;
}

Assistant:

inline void renderer::operator ()(BitmapT &bitmap_, vector_i offset, const rect_i *window, const MaskT &mask, const BlenderT &blender,
		const AlphaFn &alpha)
	{
		typedef adapter<BitmapT, BlenderT> rendition_adapter;

		rendition_adapter ra(bitmap_, offset, window, blender);
		scanline_adapter<rendition_adapter> scanline(ra, _scanline_cache, mask.width());

		render(scanline, mask, alpha, 0, 1);
	}